

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

BinOpr subexpr(LexState *ls,expdesc *v,int limit)

{
  unsigned_short *puVar1;
  int iVar2;
  BinOpr BVar3;
  TString *pTVar4;
  BinOpr op;
  UnOpr op_00;
  expdesc v2;
  
  enterlevel(ls);
  iVar2 = (ls->t).token;
  switch(iVar2) {
  case 0x107:
    v->t = -1;
    v->f = -1;
    v->k = VFALSE;
    (v->u).info = 0;
    v->ravi_type_map = 2;
    goto LAB_00120056;
  case 0x108:
  case 0x10a:
  case 0x10b:
  case 0x10c:
  case 0x10d:
  case 0x10e:
  case 0x111:
  case 0x112:
  case 0x113:
  case 0x114:
  case 0x116:
  case 0x117:
  case 0x118:
  case 0x119:
  case 0x11b:
  case 0x11c:
  case 0x11d:
  case 0x11e:
  case 0x11f:
  case 0x120:
  case 0x121:
  case 0x122:
  case 0x125:
switchD_0011fec7_caseD_108:
    suffixedexp(ls,v);
    goto LAB_00120082;
  case 0x109:
    luaX_next(ls);
    body(ls,v,0,ls->linenumber,0);
    goto LAB_00120082;
  case 0x10f:
    v->t = -1;
    v->f = -1;
    v->k = VNIL;
    (v->u).info = 0;
    v->ravi_type_map = 1;
    goto LAB_00120056;
  case 0x110:
    op_00 = OPR_NOT;
    break;
  case 0x115:
    v->t = -1;
    v->f = -1;
    v->k = VTRUE;
    (v->u).info = 0;
    v->ravi_type_map = 4;
LAB_00120056:
    v->usertype = (TString *)0x0;
    v->pc = -1;
    (v->u).ind.usertype = (TString *)0x0;
    goto LAB_0012007a;
  case 0x11a:
    if (ls->fs->f->is_vararg == '\0') {
      luaX_syntaxerror(ls,"cannot use \'...\' outside a vararg function");
    }
    iVar2 = luaK_codeABC(ls->fs,OP_VARARG,0,1,0);
    v->t = -1;
    v->f = -1;
    v->k = VVARARG;
    (v->u).info = iVar2;
    v->ravi_type_map = 0xffffffff;
    v->usertype = (TString *)0x0;
    v->pc = -1;
    (v->u).ind.usertype = (TString *)0x0;
    goto LAB_0012007a;
  case 0x123:
    v->t = -1;
    v->f = -1;
    v->k = VKFLT;
    (v->u).info = 0;
    v->ravi_type_map = 0x10;
    v->usertype = (TString *)0x0;
    v->pc = -1;
    (v->u).ind.usertype = (TString *)0x0;
    (v->u).ival = (lua_Integer)(ls->t).seminfo;
    goto LAB_0012007a;
  case 0x124:
    v->t = -1;
    v->f = -1;
    v->k = VKINT;
    (v->u).info = 0;
    v->ravi_type_map = 8;
    v->usertype = (TString *)0x0;
    v->pc = -1;
    (v->u).ind.usertype = (TString *)0x0;
    (v->u).ival = (lua_Integer)(ls->t).seminfo;
    goto LAB_0012007a;
  case 0x126:
    codestring(ls,v,(ls->t).seminfo.ts);
LAB_0012007a:
    luaX_next(ls);
LAB_00120082:
    if (((byte)ravi_parser_debug & 1) != 0) {
      raviY_printf(ls->fs,"subexpr -> simpleexpr %e\n",v);
    }
    goto LAB_0012011b;
  case 0x127:
    op_00 = OPR_TO_INTEGER;
    break;
  case 0x128:
    op_00 = OPR_TO_NUMBER;
    break;
  case 0x129:
    op_00 = OPR_TO_INTARRAY;
    break;
  case 0x12a:
    op_00 = OPR_TO_NUMARRAY;
    break;
  case 299:
    op_00 = OPR_TO_TABLE;
    break;
  case 300:
    op_00 = OPR_TO_STRING;
    break;
  case 0x12d:
    op_00 = OPR_TO_CLOSURE;
    break;
  default:
    if (iVar2 == 0x23) {
      op_00 = OPR_LEN;
      break;
    }
    if (iVar2 == 0x7e) {
      op_00 = OPR_BNOT;
      break;
    }
    if (iVar2 != 0x40) {
      if (iVar2 == 0x7b) {
        constructor(ls,v);
        goto LAB_00120082;
      }
      if (iVar2 != 0x2d) goto switchD_0011fec7_caseD_108;
      op_00 = OPR_MINUS;
      break;
    }
    iVar2 = ls->linenumber;
    pTVar4 = (ls->t).seminfo.ts;
    luaX_next(ls);
    pTVar4 = user_defined_type_name(ls,pTVar4);
    op_00 = OPR_TO_TYPE;
    goto LAB_001200f4;
  }
  iVar2 = ls->linenumber;
  luaX_next(ls);
  pTVar4 = (TString *)0x0;
LAB_001200f4:
  subexpr(ls,v,0xc);
  luaK_prefix(ls->fs,op_00,v,iVar2,pTVar4);
LAB_0012011b:
  iVar2 = (ls->t).token;
  switch(iVar2) {
  case 0x111:
    op = OPR_OR;
    break;
  case 0x112:
  case 0x113:
  case 0x114:
  case 0x115:
  case 0x116:
  case 0x117:
  case 0x11a:
    goto switchD_00120197_caseD_27;
  case 0x118:
    op = OPR_IDIV;
    break;
  case 0x119:
    op = OPR_CONCAT;
    break;
  case 0x11b:
    op = OPR_EQ;
    break;
  case 0x11c:
    op = OPR_GE;
    break;
  case 0x11d:
    op = OPR_LE;
    break;
  case 0x11e:
    op = OPR_NE;
    break;
  case 0x11f:
    op = OPR_SHL;
    break;
  case 0x120:
    op = OPR_SHR;
    break;
  default:
    switch(iVar2) {
    case 0x25:
      op = OPR_MOD;
      break;
    case 0x26:
      op = OPR_BAND;
      break;
    case 0x2a:
      op = OPR_MUL;
      break;
    case 0x2b:
      op = OPR_ADD;
      break;
    case 0x2d:
      op = OPR_SUB;
      break;
    case 0x2f:
      op = OPR_DIV;
      break;
    default:
      if (iVar2 == 0x3c) {
        op = OPR_LT;
        break;
      }
      if (iVar2 == 0x3e) {
        op = OPR_GT;
        break;
      }
      if (iVar2 == 0x5e) {
        op = OPR_POW;
        break;
      }
      if (iVar2 == 0x7c) {
        op = OPR_BOR;
        break;
      }
      if (iVar2 == 0x7e) {
        op = OPR_BXOR;
        break;
      }
      if (iVar2 == 0x101) {
        op = OPR_AND;
        break;
      }
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
switchD_00120197_caseD_27:
      op = OPR_NOBINOPR;
    }
  }
  while ((op != OPR_NOBINOPR && (limit < (int)(uint)priority[op].left))) {
    v2.usertype = (TString *)0x0;
    v2.k = VVOID;
    v2._4_4_ = 0;
    v2.u.ival = 0;
    v2.u.ind.usertype = (TString *)0x0;
    v2.t = 0;
    v2.f = 0;
    v2.ravi_type_map = 0xffffffff;
    v2._36_4_ = 0;
    v2.pc = -1;
    v2._52_4_ = 0;
    iVar2 = ls->linenumber;
    luaX_next(ls);
    luaK_infix(ls->fs,op,v);
    BVar3 = subexpr(ls,&v2,(uint)priority[op].right);
    if (((byte)ravi_parser_debug & 1) != 0) {
      raviY_printf(ls->fs,"subexpr-> %e binop(%d) %e\n",v,(ulong)op,&v2);
    }
    luaK_posfix(ls->fs,op,v,&v2,iVar2);
    op = BVar3;
    if (((byte)ravi_parser_debug & 1) != 0) {
      raviY_printf(ls->fs,"subexpr-> after posfix %e\n",v);
    }
  }
  puVar1 = &ls->L->nCcalls;
  *puVar1 = *puVar1 - 1;
  return op;
}

Assistant:

static BinOpr subexpr (LexState *ls, expdesc *v, int limit) {
  BinOpr op;
  UnOpr uop;
  enterlevel(ls);
  uop = getunopr(ls->t.token);
  if (uop != OPR_NOUNOPR) {
    int line = ls->linenumber;
	// RAVI change - get usertype if @<name>
    TString *usertype = NULL;
    if (uop == OPR_TO_TYPE) {
      usertype = ls->t.seminfo.ts;
      luaX_next(ls);
      // Check and expand to extended name if necessary
      usertype = user_defined_type_name(ls, usertype);
    }
    else {
      luaX_next(ls);
    }
    subexpr(ls, v, UNARY_PRIORITY);
    luaK_prefix(ls->fs, uop, v, line, usertype);
  }
  else {
    simpleexp(ls, v);
    DEBUG_EXPR(raviY_printf(ls->fs, "subexpr -> simpleexpr %e\n", v));
  }
  /* expand while operators have priorities higher than 'limit' */
  op = getbinopr(ls->t.token);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    expdesc v2 = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
    BinOpr nextop;
    int line = ls->linenumber;
    luaX_next(ls);
    luaK_infix(ls->fs, op, v);
    /* read sub-expression with higher priority */
    nextop = subexpr(ls, &v2, priority[op].right);
    DEBUG_EXPR(raviY_printf(ls->fs, "subexpr-> %e binop(%d) %e\n", v, (int)op, &v2));
    
    luaK_posfix(ls->fs, op, v, &v2, line);
    DEBUG_EXPR(raviY_printf(ls->fs, "subexpr-> after posfix %e\n", v));
    op = nextop;
  }
  leavelevel(ls);
  return op;  /* return first untreated operator */
}